

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_ssl_cert_buffer
          (torrent *this,string *certificate,string *private_key,string *dh_params)

{
  context *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  error_code ec;
  const_buffer dh_params_buf;
  const_buffer private_key_buf;
  undefined1 local_48 [16];
  const_buffer certificate_buf;
  
  this_00 = (this->m_ssl_ctx)._M_t.
            super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
            ._M_t.
            super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
            .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  if (this_00 != (context *)0x0) {
    certificate_buf.data_ = (certificate->_M_dataplus)._M_p;
    certificate_buf.size_ = certificate->_M_string_length;
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    boost::asio::ssl::context::use_certificate(this_00,&certificate_buf,pem,&ec);
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&private_key_buf);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[14]>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar1),
                   (torrent_handle *)&private_key_buf,&ec,(char (*) [14])"[certificate]");
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&private_key_buf.size_);
      }
    }
    private_key_buf.data_ = (private_key->_M_dataplus)._M_p;
    private_key_buf.size_ = private_key->_M_string_length;
    boost::asio::ssl::context::use_private_key
              ((this->m_ssl_ctx)._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
               .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
               &private_key_buf,pem,&ec);
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&dh_params_buf);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[14]>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar1),(torrent_handle *)&dh_params_buf
                   ,&ec,(char (*) [14])"[private key]");
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&dh_params_buf.size_);
      }
    }
    dh_params_buf.data_ = (dh_params->_M_dataplus)._M_p;
    dh_params_buf.size_ = dh_params->_M_string_length;
    boost::asio::ssl::context::use_tmp_dh
              ((this->m_ssl_ctx)._M_t.
               super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
               .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
               &dh_params_buf,&ec);
    if (ec.failed_ == true) {
      iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_03,iVar1) + 0x68) & 0x41) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_48);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[12]>
                  ((alert_manager *)CONCAT44(extraout_var_04,iVar1),(torrent_handle *)local_48,&ec,
                   (char (*) [12])"[dh params]");
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
      }
    }
  }
  return;
}

Assistant:

void torrent::set_ssl_cert_buffer(std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params)
	{
		if (!m_ssl_ctx) return;

		boost::asio::const_buffer certificate_buf(certificate.c_str(), certificate.size());

		error_code ec;
		m_ssl_ctx->use_certificate(certificate_buf, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[certificate]");
		}

		boost::asio::const_buffer private_key_buf(private_key.c_str(), private_key.size());
		m_ssl_ctx->use_private_key(private_key_buf, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[private key]");
		}

		boost::asio::const_buffer dh_params_buf(dh_params.c_str(), dh_params.size());
		m_ssl_ctx->use_tmp_dh(dh_params_buf, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[dh params]");
		}
	}